

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_result ma_audio_buffer_ref_map
                    (ma_audio_buffer_ref *pAudioBufferRef,void **ppFramesOut,ma_uint64 *pFrameCount)

{
  ma_result mVar1;
  ulong uVar2;
  ulong uVar3;
  
  if (ppFramesOut != (void **)0x0) {
    *ppFramesOut = (void *)0x0;
  }
  if (pFrameCount == (ma_uint64 *)0x0) {
    uVar3 = 0;
  }
  else {
    uVar3 = *pFrameCount;
    *pFrameCount = 0;
  }
  mVar1 = MA_INVALID_ARGS;
  if ((pAudioBufferRef != (ma_audio_buffer_ref *)0x0 && ppFramesOut != (void **)0x0) &&
      pFrameCount != (ma_uint64 *)0x0) {
    uVar2 = pAudioBufferRef->sizeInFrames - pAudioBufferRef->cursor;
    if (uVar3 < uVar2) {
      uVar2 = uVar3;
    }
    *ppFramesOut = (void *)((ulong)((&DAT_0017d490)[pAudioBufferRef->format] *
                                   pAudioBufferRef->channels) * pAudioBufferRef->cursor +
                           (long)pAudioBufferRef->pData);
    *pFrameCount = uVar2;
    mVar1 = MA_SUCCESS;
  }
  return mVar1;
}

Assistant:

MA_API ma_result ma_audio_buffer_ref_map(ma_audio_buffer_ref* pAudioBufferRef, void** ppFramesOut, ma_uint64* pFrameCount)
{
    ma_uint64 framesAvailable;
    ma_uint64 frameCount = 0;

    if (ppFramesOut != NULL) {
        *ppFramesOut = NULL;    /* Safety. */
    }

    if (pFrameCount != NULL) {
        frameCount = *pFrameCount;
        *pFrameCount = 0;       /* Safety. */
    }

    if (pAudioBufferRef == NULL || ppFramesOut == NULL || pFrameCount == NULL) {
        return MA_INVALID_ARGS;
    }

    framesAvailable = pAudioBufferRef->sizeInFrames - pAudioBufferRef->cursor;
    if (frameCount > framesAvailable) {
        frameCount = framesAvailable;
    }

    *ppFramesOut = ma_offset_ptr(pAudioBufferRef->pData, pAudioBufferRef->cursor * ma_get_bytes_per_frame(pAudioBufferRef->format, pAudioBufferRef->channels));
    *pFrameCount = frameCount;

    return MA_SUCCESS;
}